

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeSignalImplDefine(CodeGenerator *this,ostream *s,Class *clazz)

{
  pointer pSVar1;
  char *pcVar2;
  int iVar3;
  ostream *poVar4;
  Signal *sig;
  pointer pSVar5;
  pointer pPVar6;
  char *local_58;
  string name;
  
  poVar4 = std::operator<<(s,"// Signal definitions");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"#define RENGINE_DEFINE_SIGNALS_");
  poVar4 = std::operator<<(poVar4,(string *)clazz);
  poVar4 = std::operator<<(poVar4," \\");
  std::endl<char,std::char_traits<char>>(poVar4);
  pSVar1 = (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar5 = (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1) {
    poVar4 = std::operator<<(s,"    rengine::Signal<");
    poVar4 = std::operator<<(poVar4,(string *)&pSVar5->signature);
    poVar4 = std::operator<<(poVar4,"> ");
    poVar4 = std::operator<<(poVar4,(string *)clazz);
    poVar4 = std::operator<<(poVar4,"::");
    poVar4 = std::operator<<(poVar4,(string *)&pSVar5->name);
    std::operator<<(poVar4,";");
  }
  name.field_2._8_8_ =
       (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (pPVar6 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar6 != (pointer)name.field_2._8_8_;
      pPVar6 = pPVar6 + 1) {
    std::__cxx11::string::string((string *)&local_58,(string *)&pPVar6->name);
    pcVar2 = local_58;
    iVar3 = toupper((int)*local_58);
    *pcVar2 = (char)iVar3;
    poVar4 = std::operator<<(s,"    rengine::Signal<> ");
    poVar4 = std::operator<<(poVar4,(string *)clazz);
    poVar4 = std::operator<<(poVar4,"::on");
    poVar4 = std::operator<<(poVar4,(string *)&local_58);
    poVar4 = std::operator<<(poVar4,"Changed;");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::endl<char,std::char_traits<char>>(s);
  return;
}

Assistant:

void CodeGenerator::writeSignalImplDefine(std::ostream &s, Class *clazz)
{
    // ### Won't work with classes in namespaces, but then again, that will
    // need changes all around..
    s << "// Signal definitions" << std::endl
      << "#define RENGINE_DEFINE_SIGNALS_" << clazz->name << " \\" << std::endl;
    for (const Signal &sig : clazz->signals)
        s << "    rengine::Signal<" << sig.signature << "> " << clazz->name << "::" << sig.name << ";";
    for (const Property &prop : clazz->properties) {
        std::string name = prop.name;
        name[0] = std::toupper(name[0]);
        s << "    rengine::Signal<> " << clazz->name << "::on" << name << "Changed;" << std::endl;
    }
    // for (const Replicator &r : clazz->replicators)
    //     s << "    rengine::Signal<> " << clazz->name << "::Replicator_" << r.id << "::onCountChanged;";

    s << std::endl;
}